

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O0

void __thiscall spvtools::opt::IRContext::BuildCFG(IRContext *this)

{
  Analysis AVar1;
  Module *local_20;
  unique_ptr<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_> local_18;
  IRContext *local_10;
  IRContext *this_local;
  
  local_10 = this;
  local_20 = module(this);
  MakeUnique<spvtools::opt::CFG,spvtools::opt::Module*>((spvtools *)&local_18,&local_20);
  std::unique_ptr<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>::operator=
            (&this->cfg_,&local_18);
  std::unique_ptr<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>::~unique_ptr
            (&local_18);
  AVar1 = opt::operator|(this->valid_analyses_,kAnalysisCFG);
  this->valid_analyses_ = AVar1;
  return;
}

Assistant:

void BuildCFG() {
    cfg_ = MakeUnique<CFG>(module());
    valid_analyses_ = valid_analyses_ | kAnalysisCFG;
  }